

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void gflags::anon_unknown_5::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run(void)

{
  FlagSaver local_10;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","FlagSaverTest","CanSaveVariousTypedFlagValues");
  RunTest();
  FlagSaver::~FlagSaver(&local_10);
  return;
}

Assistant:

TEST(FlagSaverTest, CanSaveVariousTypedFlagValues) {
  // Initializes the flags.
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_uint32 = 2;
  FLAGS_test_int64 = -3;
  FLAGS_test_uint64 = 4;
  FLAGS_test_double = 5.0;
  FLAGS_test_string = "good";

  // Saves the flag states.
  {
    FlagSaver fs;

    // Modifies the flags.
    FLAGS_test_bool = true;
    FLAGS_test_int32 = -5;
    FLAGS_test_uint32 = 6;
    FLAGS_test_int64 = -7;
    FLAGS_test_uint64 = 8;
    FLAGS_test_double = 8.0;
    FLAGS_test_string = "bad";

    // Restores the flag states.
  }

  // Verifies the flag values were restored.
  EXPECT_FALSE(FLAGS_test_bool);
  EXPECT_EQ(-1, FLAGS_test_int32);
  EXPECT_EQ(2, FLAGS_test_uint32);
  EXPECT_EQ(-3, FLAGS_test_int64);
  EXPECT_EQ(4, FLAGS_test_uint64);
  EXPECT_DOUBLE_EQ(5.0, FLAGS_test_double);
  EXPECT_EQ("good", FLAGS_test_string);
}